

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typesystem.cpp
# Opt level: O0

void __thiscall cxx::TypeGrammar::TypeGrammar(TypeGrammar *this)

{
  adder *paVar1;
  char *local_4e0;
  BuiltinType local_4d4;
  char *local_4d0;
  BuiltinType local_4c4;
  char *local_4c0;
  BuiltinType local_4b4;
  char *local_4b0;
  BuiltinType local_4a4;
  char *local_4a0;
  BuiltinType local_494;
  char *local_490;
  BuiltinType local_484;
  char *local_480;
  BuiltinType local_474;
  char *local_470;
  BuiltinType local_464;
  char *local_460;
  BuiltinType local_454;
  char *local_450;
  BuiltinType local_444;
  char *local_440;
  BuiltinType local_434;
  char *local_430;
  BuiltinType local_424;
  char *local_420;
  BuiltinType local_414;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  local_410;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  local_400;
  type local_3f0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[13]>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&>,_2L>
  local_3e0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[13]>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&>,_2L>
  local_3d0;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::karma::symbols<fidler::ast::BuiltinType,_const_char_*,_std::map<fidler::ast::BuiltinType,_const_char_*,_std::less<fidler::ast::BuiltinType>,_std::allocator<std::pair<const_fidler::ast::BuiltinType,_const_char_*>_>_>,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  local_3c0;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::karma::symbols<fidler::ast::BuiltinType,_const_char_*,_std::map<fidler::ast::BuiltinType,_const_char_*,_std::less<fidler::ast::BuiltinType>,_std::allocator<std::pair<const_fidler::ast::BuiltinType,_const_char_*>_>_>,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>_&,_const_boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::string,_boost::spirit::char_encoding::standard>_>_&>,_2L>
  local_3b0;
  allocator local_399;
  string local_398;
  allocator local_371;
  string local_370;
  allocator local_349;
  string local_348;
  allocator local_311;
  string local_310;
  TypeGrammar *local_2f0;
  TypeGrammar *this_local;
  undefined1 *local_2e0;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::karma::symbols<fidler::ast::BuiltinType,_const_char_*,_std::map<fidler::ast::BuiltinType,_const_char_*,_std::less<fidler::ast::BuiltinType>,_std::allocator<std::pair<const_fidler::ast::BuiltinType,_const_char_*>_>_>,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  *local_2d8;
  expr<boost::proto::tagns_::tag::bitwise_or,_boost::proto::argsns_::list2<boost::spirit::karma::rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>_&,_boost::spirit::karma::symbols<fidler::ast::BuiltinType,_const_char_*,_std::map<fidler::ast::BuiltinType,_const_char_*,_std::less<fidler::ast::BuiltinType>,_std::allocator<std::pair<const_fidler::ast::BuiltinType,_const_char_*>_>_>,_boost::spirit::unused_type,_boost::spirit::unused_type>_&>,_2L>
  *local_2d0;
  proto_child1 local_2c8;
  karma_symbols<ast::BuiltinType> *local_2b8;
  karma_rule<ast::IntegerInterval_()> *local_2b0;
  karma_rule<ast::IntegerInterval_()> *local_2a8;
  karma_symbols<ast::BuiltinType> *local_2a0;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  *local_290;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[13]>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&>,_2L>
  *local_288;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[13]>_>_>,_0L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&>,_2L>
  *local_280;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  *local_278;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  *local_268;
  type *local_260;
  type *local_258;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  that_4;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::omit>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  that_2;
  expr_type that;
  expr_type that_1;
  undefined1 local_121;
  undefined1 *local_120;
  undefined1 local_111;
  undefined1 *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  type *ptStack_e0;
  expr_type that_3;
  expr_type that_5;
  
  local_2f0 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_310,"unnamed-grammar",&local_311);
  boost::spirit::karma::
  grammar<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::grammar(&this->super_karma_grammar<ast::Type_()>,&this->type_,&local_310);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_348,"unnamed-rule",&local_349);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_boost::variant<fidler::ast::BuiltinType,_fidler::ast::IntegerInterval,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->type_,&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_370,"unnamed-rule",&local_371);
  boost::spirit::karma::
  rule<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->integer_interval_,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_398,"symbols",&local_399);
  boost::spirit::karma::
  symbols<fidler::ast::BuiltinType,_const_char_*,_std::map<fidler::ast::BuiltinType,_const_char_*,_std::less<fidler::ast::BuiltinType>,_std::allocator<std::pair<const_fidler::ast::BuiltinType,_const_char_*>_>_>,_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::symbols(&this->builtin_type_,&local_398);
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  local_3c0.child0 = &this->integer_interval_;
  local_3c0.child1 = &this->builtin_type_;
  local_3b0.child0 = &local_3c0;
  local_2e0 = &boost::spirit::standard::string;
  local_3b0.child1 = (proto_child1)&boost::spirit::standard::string;
  local_2d8 = local_3b0.child0;
  local_2d0 = local_3b0.child0;
  local_2c8 = local_3b0.child1;
  local_2b8 = local_3c0.child1;
  local_2b0 = local_3c0.child0;
  local_2a8 = local_3c0.child0;
  local_2a0 = local_3c0.child1;
  boost::spirit::karma::operator%=(&this->type_,&local_3b0);
  boost::spirit::terminal<boost::spirit::tag::lit>::operator()
            (&local_3f0,(terminal<boost::spirit::tag::lit> *)&boost::spirit::lit,
             (char (*) [13])"std::int32_t",(is_false)0x0);
  that_4.child1 = (proto_child1)&boost::spirit::int_;
  local_120 = &boost::spirit::int_;
  local_f0 = &local_121;
  local_f8 = &boost::spirit::int_;
  local_400.child0 = (proto_child0)&boost::spirit::omit;
  local_400.child1 = (proto_child1)&boost::spirit::int_;
  local_3e0.child0 = &local_3f0;
  local_3e0.child1 = &local_400;
  local_240 = &boost::spirit::omit;
  local_248 = &boost::spirit::int_;
  local_238 = &boost::spirit::omit;
  local_110 = &boost::spirit::int_;
  local_100 = &local_111;
  local_108 = &boost::spirit::int_;
  local_410.child0 = (proto_child0)&boost::spirit::omit;
  local_410.child1 = (proto_child1)&boost::spirit::int_;
  local_3d0.child0 = &local_3e0;
  local_3d0.child1 = &local_410;
  local_290 = local_3d0.child1;
  local_288 = local_3d0.child0;
  local_280 = local_3d0.child0;
  local_278 = local_3d0.child1;
  local_268 = local_3e0.child1;
  local_260 = local_3e0.child0;
  local_258 = local_3e0.child0;
  local_250 = local_3e0.child1;
  ptStack_e0 = local_3e0.child0;
  that_3.child0 = (proto_child0)local_3e0.child1;
  that_3.child1 = local_3e0.child1;
  boost::spirit::karma::operator%=(&this->integer_interval_,&local_3d0);
  local_414 = Int8;
  local_420 = "std::int8_t";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(&(this->builtin_type_).add,&local_414,&local_420);
  local_424 = UInt8;
  local_430 = "std::uint8_t";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,&local_424,&local_430);
  local_434 = Int16;
  local_440 = "std::int16_t";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,&local_434,&local_440);
  local_444 = UInt16;
  local_450 = "std::uint16_t";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,&local_444,&local_450);
  local_454 = Int32;
  local_460 = "std::int32_t";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,&local_454,&local_460);
  local_464 = UInt32;
  local_470 = "std::uint32_t";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,&local_464,&local_470);
  local_474 = Int64;
  local_480 = "std::int64_t";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,&local_474,&local_480);
  local_484 = UInt64;
  local_490 = "std::uint64_t";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,&local_484,&local_490);
  local_494 = Boolean;
  local_4a0 = "bool";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,&local_494,&local_4a0);
  local_4a4 = String;
  local_4b0 = "std::string";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,&local_4a4,&local_4b0);
  local_4b4 = Float;
  local_4c0 = "float";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,&local_4b4,&local_4c0);
  local_4c4 = Double;
  local_4d0 = "double";
  paVar1 = boost::spirit::karma::
           symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
           ::adder::operator()(paVar1,&local_4c4,&local_4d0);
  local_4d4 = ByteBuffer;
  local_4e0 = "std::vector<std::uint8_t>";
  boost::spirit::karma::
  symbols<fidler::ast::BuiltinType,char_const*,std::map<fidler::ast::BuiltinType,char_const*,std::less<fidler::ast::BuiltinType>,std::allocator<std::pair<fidler::ast::BuiltinType_const,char_const*>>>,boost::spirit::unused_type,boost::spirit::unused_type>
  ::adder::operator()(paVar1,&local_4d4,&local_4e0);
  return;
}

Assistant:

TypeGrammar::TypeGrammar() :
		TypeGrammar::base_type(type_)
{
	namespace karma = boost::spirit::karma;

	type_
		%= integer_interval_
		| builtin_type_
		| karma::string
		;

	integer_interval_
		%= karma::lit("std::int32_t")
		<< karma::omit[karma::int_]
		<< karma::omit[karma::int_]
		;

	builtin_type_.add
		(ast::BuiltinType::Int8,       "std::int8_t")
		(ast::BuiltinType::UInt8,      "std::uint8_t")
		(ast::BuiltinType::Int16,      "std::int16_t")
		(ast::BuiltinType::UInt16,     "std::uint16_t")
		(ast::BuiltinType::Int32,      "std::int32_t")
		(ast::BuiltinType::UInt32,     "std::uint32_t")
		(ast::BuiltinType::Int64,      "std::int64_t")
		(ast::BuiltinType::UInt64,     "std::uint64_t")
		(ast::BuiltinType::Boolean,    "bool")
		(ast::BuiltinType::String,     "std::string")
		(ast::BuiltinType::Float,      "float")
		(ast::BuiltinType::Double,     "double")
		(ast::BuiltinType::ByteBuffer, "std::vector<std::uint8_t>")
		;
}